

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O0

int __thiscall Fl_Clock::handle(Fl_Clock *this,int event)

{
  int iVar1;
  int event_local;
  Fl_Clock *this_local;
  
  if (event == 0xf) {
    Fl::remove_timeout(tick,this);
  }
  else if (event == 0x10) {
    tick(this);
  }
  iVar1 = Fl_Widget::handle((Fl_Widget *)this,event);
  return iVar1;
}

Assistant:

int Fl_Clock::handle(int event) {
  switch (event) {
  case FL_SHOW:
    tick(this);
    break;
  case FL_HIDE:
    Fl::remove_timeout(tick, this);
    break;
  }
  return Fl_Clock_Output::handle(event);
}